

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O1

void ApplicativeHelper::getHeadAndAllArgs(TermList term,TermList *head,TermStack *args)

{
  uint64_t uVar1;
  TermList *pTVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  TermList local_30;
  
  local_30._content = term._content;
  bVar3 = Kernel::TermList::isApplication(&local_30);
  if (bVar3) {
    do {
      uVar1 = *(uint64_t *)
               (local_30._content + 0x10 +
               (ulong)(*(uint *)(local_30._content + 0xc) & 0xfffffff) * 8);
      if (args->_cursor == args->_end) {
        ::Lib::Stack<Kernel::TermList>::expand(args);
      }
      pTVar2 = args->_cursor;
      pTVar2->_content = uVar1;
      args->_cursor = pTVar2 + 1;
      local_30._content =
           *(uint64_t *)
            (local_30._content + 0x18 + (ulong)(*(uint *)(local_30._content + 0xc) & 0xfffffff) * 8)
      ;
      bVar3 = Kernel::TermList::isApplication(&local_30);
    } while (bVar3);
  }
  head->_content = (uint64_t)local_30;
  if ((local_30._content & 3) == 0) {
    uVar4 = *(uint *)(local_30._content + 0xc) & 0xfffffff;
    if (uVar4 != 0) {
      iVar5 = uVar4 + 1;
      lVar6 = -(ulong)uVar4;
      do {
        lVar6 = lVar6 + 1;
        uVar1 = *(uint64_t *)
                 (local_30._content + 0x28 +
                 ((ulong)(*(uint *)(local_30._content + 0xc) & 0xfffffff) + lVar6) * 8);
        if (args->_cursor == args->_end) {
          ::Lib::Stack<Kernel::TermList>::expand(args);
        }
        pTVar2 = args->_cursor;
        pTVar2->_content = uVar1;
        args->_cursor = pTVar2 + 1;
        iVar5 = iVar5 + -1;
      } while (1 < iVar5);
    }
  }
  return;
}

Assistant:

void ApplicativeHelper::getHeadAndAllArgs(TermList term, TermList& head, TermStack& args)
{
  while(term.isApplication()){
    args.push(*term.term()->nthArgument(3)); 
    term = *term.term()->nthArgument(2);
  }
  head = term;  
  if(term.isTerm()){
    unsigned arity = term.term()->arity();
    for(int i = arity-1; i >= 0; i--){
      args.push(*term.term()->nthArgument(i));
    }
  }
}